

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

Type __thiscall wabt::Func::GetLocalType(Func *this,Index index)

{
  pointer pTVar1;
  Index IVar2;
  Type TVar3;
  uint uVar4;
  Index i;
  
  pTVar1 = (this->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (uint)((ulong)((long)(this->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pTVar1) >> 2);
  i = index - uVar4;
  if (index < uVar4) {
    return pTVar1[index];
  }
  IVar2 = LocalTypes::size(&this->local_types);
  if (i < IVar2) {
    TVar3 = LocalTypes::operator[](&this->local_types,i);
    return TVar3;
  }
  __assert_fail("index < local_types.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.cc"
                ,0xcb,"Type wabt::Func::GetLocalType(Index) const");
}

Assistant:

Type Func::GetLocalType(Index index) const {
  Index num_params = decl.GetNumParams();
  if (index < num_params) {
    return GetParamType(index);
  } else {
    index -= num_params;
    assert(index < local_types.size());
    return local_types[index];
  }
}